

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::EmitSyncMarker
          (TracingServiceImpl *this,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  size_t *psVar1;
  RootMessage<perfetto::protos::pbzero::TracePacket> *this_00;
  pointer pTVar2;
  StaticBuffered<perfetto::protos::pbzero::TracePacket> packet;
  size_t local_b0;
  StaticBuffered<perfetto::protos::pbzero::TracePacket> local_a8;
  
  if (this->sync_marker_packet_size_ == 0) {
    protozero::StaticBuffered<perfetto::protos::pbzero::TracePacket>::StaticBuffered
              (&local_a8,this->sync_marker_packet_,0x20);
    this_00 = &local_a8.msg_;
    protozero::Message::AppendVarInt<int>((Message *)this_00,3,this->uid_);
    protozero::Message::AppendVarInt<unsigned_int>((Message *)this_00,10,1);
    protozero::Message::AppendBytes((Message *)this_00,0x24,kSyncMarker,0x10);
    protozero::Message::Finalize((Message *)this_00);
    this->sync_marker_packet_size_ =
         (long)local_a8.writer_.write_ptr_ - (long)local_a8.delegate_.range_.begin;
    protozero::MessageArena::~MessageArena(&local_a8.msg_.root_arena_);
    protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&local_a8.writer_);
    protozero::StaticBufferDelegate::~StaticBufferDelegate(&local_a8.delegate_);
  }
  std::vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>::emplace_back<>
            (packets);
  pTVar2 = (packets->
           super__Vector_base<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  local_b0 = this->sync_marker_packet_size_;
  local_a8.delegate_.super_Delegate._vptr_Delegate = (_func_int **)this->sync_marker_packet_;
  psVar1 = &pTVar2[-1].size_;
  *psVar1 = *psVar1 + local_b0;
  ::std::vector<perfetto::Slice,std::allocator<perfetto::Slice>>::
  emplace_back<void_const*&,unsigned_long&>
            ((vector<perfetto::Slice,std::allocator<perfetto::Slice>> *)(pTVar2 + -1),
             (void **)&local_a8,&local_b0);
  return;
}

Assistant:

void TracingServiceImpl::EmitSyncMarker(std::vector<TracePacket>* packets) {
  // The sync marks are used to tokenize large traces efficiently.
  // See description in trace_packet.proto.
  if (sync_marker_packet_size_ == 0) {
    // The marker ABI expects that the marker is written after the uid.
    // Protozero guarantees that fields are written in the same order of the
    // calls. The ResynchronizeTraceStreamUsingSyncMarker test verifies the ABI.
    protozero::StaticBuffered<protos::pbzero::TracePacket> packet(
        &sync_marker_packet_[0], sizeof(sync_marker_packet_));
    packet->set_trusted_uid(static_cast<int32_t>(uid_));
    packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);

    // Keep this last.
    packet->set_synchronization_marker(kSyncMarker, sizeof(kSyncMarker));
    sync_marker_packet_size_ = packet.Finalize();
  }
  packets->emplace_back();
  packets->back().AddSlice(&sync_marker_packet_[0], sync_marker_packet_size_);
}